

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

ActionResult __thiscall
wabt::anon_unknown_4::ScriptValidator::CheckAction(ScriptValidator *this,Action *action)

{
  pointer pCVar1;
  string_view name;
  string_view name_00;
  InvokeAction *pIVar2;
  Module *pMVar3;
  Export *pEVar4;
  Func *pFVar5;
  ulong uVar6;
  GetAction *pGVar7;
  Global *pGVar8;
  char *pcVar9;
  size_t i;
  ulong uVar10;
  long lVar11;
  anon_union_8_2_516a9242_for_ActionResult_2 aVar12;
  ActionResult AVar13;
  
  if (action->type_ == Get) {
    pGVar7 = cast<wabt::GetAction,wabt::Action>(action);
    pMVar3 = Script::GetModule(this->script_,
                               &(pGVar7->super_ActionMixin<(wabt::ActionType)1>).super_Action.
                                module_var);
    if (pMVar3 == (Module *)0x0) {
      PrintError(this,&(pGVar7->super_ActionMixin<(wabt::ActionType)1>).super_Action.loc,
                 "unknown module");
    }
    else {
      name_00.data_ =
           (pGVar7->super_ActionMixin<(wabt::ActionType)1>).super_Action.name._M_dataplus._M_p;
      name_00.size_ =
           (pGVar7->super_ActionMixin<(wabt::ActionType)1>).super_Action.name._M_string_length;
      pEVar4 = Module::GetExport(pMVar3,name_00);
      if (pEVar4 == (Export *)0x0) {
        PrintError(this,&(pGVar7->super_ActionMixin<(wabt::ActionType)1>).super_Action.loc,
                   "unknown global export \"%s\"",
                   (pGVar7->super_ActionMixin<(wabt::ActionType)1>).super_Action.name._M_dataplus.
                   _M_p);
      }
      else {
        pGVar8 = Module::GetGlobal(pMVar3,&pEVar4->var);
        if (pGVar8 != (Global *)0x0) {
          aVar12._4_4_ = 0;
          aVar12.type.enum_ = (Type)(Type)(pGVar8->type).enum_;
          uVar6 = 2;
          goto LAB_0016a45e;
        }
      }
    }
  }
  else if (action->type_ == Invoke) {
    pIVar2 = cast<wabt::InvokeAction,wabt::Action>(action);
    pMVar3 = Script::GetModule(this->script_,
                               &(pIVar2->super_ActionMixin<(wabt::ActionType)0>).super_Action.
                                module_var);
    if (pMVar3 == (Module *)0x0) {
      aVar12.types = (TypeVector *)0x0;
      PrintError(this,&(pIVar2->super_ActionMixin<(wabt::ActionType)0>).super_Action.loc,
                 "unknown module");
    }
    else {
      name.data_ = (pIVar2->super_ActionMixin<(wabt::ActionType)0>).super_Action.name._M_dataplus.
                   _M_p;
      name.size_ = (pIVar2->super_ActionMixin<(wabt::ActionType)0>).super_Action.name.
                   _M_string_length;
      pEVar4 = Module::GetExport(pMVar3,name);
      if (pEVar4 == (Export *)0x0) {
        aVar12.types = (TypeVector *)0x0;
        PrintError(this,&(pIVar2->super_ActionMixin<(wabt::ActionType)0>).super_Action.loc,
                   "unknown function export \"%s\"",
                   (pIVar2->super_ActionMixin<(wabt::ActionType)0>).super_Action.name._M_dataplus.
                   _M_p);
      }
      else {
        pFVar5 = Module::GetFunc(pMVar3,&pEVar4->var);
        if (pFVar5 == (Func *)0x0) {
          aVar12.types = (TypeVector *)0x0;
        }
        else {
          uVar6 = ((long)(pIVar2->args).
                         super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(pIVar2->args).super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x48;
          uVar10 = (ulong)((long)(pFVar5->decl).sig.param_types.
                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                                 .super__Vector_impl_data._M_finish -
                          (long)(pFVar5->decl).sig.param_types.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2 & 0xffffffff;
          if (uVar6 == uVar10) {
            lVar11 = 0;
            for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
              pCVar1 = (pIVar2->args).super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              CheckTypeIndex(this,(Location *)((pCVar1->data_).v + lVar11 + -0x28),
                             (Type)*(Enum *)((pCVar1->data_).v + lVar11 + -8),
                             (Type)(pFVar5->decl).sig.param_types.
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar10 & 0xffffffff].
                                   enum_,"invoke",(Index)uVar10,"argument");
              lVar11 = lVar11 + 0x48;
            }
            aVar12.types = &(pFVar5->decl).sig.result_types;
          }
          else {
            pcVar9 = "few";
            if (uVar10 < uVar6) {
              pcVar9 = "many";
            }
            aVar12.types = (TypeVector *)0x0;
            PrintError(this,&(pIVar2->super_ActionMixin<(wabt::ActionType)0>).super_Action.loc,
                       "too %s parameters to function. got %zd, expected %zd",pcVar9,uVar6);
          }
        }
      }
    }
    uVar6 = (ulong)(aVar12.types != (TypeVector *)0x0);
    goto LAB_0016a45e;
  }
  uVar6 = 0;
  aVar12.types = (TypeVector *)0x0;
LAB_0016a45e:
  AVar13.field_1.types = aVar12.types;
  AVar13._0_8_ = uVar6;
  return AVar13;
}

Assistant:

ScriptValidator::ActionResult ScriptValidator::CheckAction(
    const Action* action) {
  ActionResult result;
  ZeroMemory(result);

  switch (action->type()) {
    case ActionType::Invoke:
      result.types = CheckInvoke(cast<InvokeAction>(action));
      result.kind =
          result.types ? ActionResult::Kind::Types : ActionResult::Kind::Error;
      break;

    case ActionType::Get:
      if (Succeeded(CheckGet(cast<GetAction>(action), &result.type))) {
        result.kind = ActionResult::Kind::Type;
      } else {
        result.kind = ActionResult::Kind::Error;
      }
      break;
  }

  return result;
}